

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::validate(Arg *this)

{
  int iVar1;
  logic_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*((this->boundField).functionObj)->_vptr_IArgFunction[4])();
  if (((char)iVar1 != '\0') && ((this->hint)._M_string_length == 0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    dbgName_abi_cxx11_(&sStack_58,this);
    std::operator+(&local_38,&sStack_58," must specify an arg name");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void validate() const {
                if( boundField.takesArg() && !takesArg() )
                    throw std::logic_error( dbgName() + " must specify an arg name" );
            }